

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qr.c
# Opt level: O2

bool_t qrIsOperable(qr_o *r)

{
  bool_t bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = objIsOperable(r);
  uVar2 = 0;
  uVar3 = 0;
  if ((((bVar1 != 0) && (0x8f < (r->hdr).keep)) && ((r->hdr).p_count == 3)) &&
     (((uVar2 = uVar3, (r->hdr).o_count == 0 && (r->n != 0)) && (r->no != 0)))) {
    bVar1 = memIsValid(r->unity,r->n << 3);
    if (((bVar1 != 0) && (r->from != (qr_from_i)0x0)) &&
       (((r->to != (qr_to_i)0x0 &&
         ((((r->add != (qr_add_i)0x0 && (r->sub != (qr_sub_i)0x0)) && (r->neg != (qr_neg_i)0x0)) &&
          ((r->mul != (qr_mul_i)0x0 && (r->sqr != (qr_sqr_i)0x0)))))) && (r->inv != (qr_inv_i)0x0)))
       ) {
      uVar2 = (uint)(r->div != (qr_div_i)0x0);
    }
  }
  return uVar2;
}

Assistant:

bool_t qrIsOperable(const qr_o* r)
{
	return objIsOperable(r) &&
		objKeep(r) >= sizeof(qr_o) &&
		objPCount(r) == 3 &&
		objOCount(r) == 0 &&
		r->n > 0 && r->no > 0 &&
		wwIsValid(r->unity, r->n) &&
		r->from != 0 &&	
		r->to != 0 &&	
		r->add != 0 &&	
		r->sub != 0 &&	
		r->neg != 0 &&	
		r->mul != 0 &&	
		r->sqr != 0 &&	
		r->inv != 0 &&	
		r->div != 0;
}